

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

void sexp_set_parameter(sexp ctx,sexp env,sexp name,sexp value)

{
  sexp psVar1;
  sexp psVar2;
  
  psVar1 = sexp_env_cell_loc(ctx,env,name,0,(sexp_conflict *)0x0);
  if (psVar1 == (sexp)0x0) {
    psVar1 = (sexp)&DAT_0000003e;
  }
  else {
    psVar1 = (psVar1->value).type.cpl;
  }
  if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x1b)) {
    psVar2 = (psVar1->value).type.cpl;
    if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 6)) {
      (psVar2->value).type.cpl = value;
    }
    else {
      psVar2 = sexp_cons_op(ctx,(sexp)0x0,2,name,value);
      (psVar1->value).type.cpl = psVar2;
    }
    return;
  }
  sexp_warn(ctx,"can\'t set non-parameter: ",name);
  return;
}

Assistant:

void sexp_set_parameter (sexp ctx, sexp env, sexp name, sexp value) {
  sexp param = sexp_env_ref(ctx, env, name, SEXP_FALSE);
  if (sexp_opcodep(param)) {
    if (! sexp_pairp(sexp_opcode_data(param)))
      sexp_opcode_data(param) = sexp_cons(ctx, name, value);
    else
      sexp_cdr(sexp_opcode_data(param)) = value;
  } else {
    sexp_warn(ctx, "can't set non-parameter: ", name);
  }
}